

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O3

void icu_63::number::impl::blueprint_helpers::generateScaleOption
               (int32_t magnitude,DecNum *arbitrary,UnicodeString *sb,UErrorCode *status)

{
  DecimalQuantity dq;
  DecimalQuantity local_b0;
  UnicodeString local_60;
  
  DecimalQuantity::DecimalQuantity(&local_b0);
  if (arbitrary == (DecNum *)0x0) {
    DecimalQuantity::setToInt(&local_b0,1);
  }
  else {
    DecimalQuantity::setToDecNum(&local_b0,arbitrary,status);
    if (U_ZERO_ERROR < *status) goto LAB_00265399;
  }
  DecimalQuantity::adjustMagnitude(&local_b0,magnitude);
  DecimalQuantity::roundToInfinity(&local_b0);
  DecimalQuantity::toPlainString(&local_60,&local_b0);
  if (-1 < local_60.fUnion.fStackFields.fLengthAndFlags) {
    local_60.fUnion.fFields.fLength = (int)local_60.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  UnicodeString::doAppend(sb,&local_60,0,local_60.fUnion.fFields.fLength);
  UnicodeString::~UnicodeString(&local_60);
LAB_00265399:
  DecimalQuantity::~DecimalQuantity(&local_b0);
  return;
}

Assistant:

void blueprint_helpers::generateScaleOption(int32_t magnitude, const DecNum* arbitrary, UnicodeString& sb,
                                            UErrorCode& status) {
    // Utilize DecimalQuantity/double_conversion to format this for us.
    DecimalQuantity dq;
    if (arbitrary != nullptr) {
        dq.setToDecNum(*arbitrary, status);
        if (U_FAILURE(status)) { return; }
    } else {
        dq.setToInt(1);
    }
    dq.adjustMagnitude(magnitude);
    dq.roundToInfinity();
    sb.append(dq.toPlainString());
}